

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeInternalForces(ChElementTetraCorot_4 *this)

{
  ChVectorDynamic<> *in_RSI;
  
  ComputeInternalForces((ChElementTetraCorot_4 *)&this[-1].field_0x1b8,in_RSI);
  return;
}

Assistant:

void ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);  // nodal displacements, local

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    displ.segment(0, 3) = (A.transpose() * nodes[0]->pos_dt).eigen();  // nodal speeds, local
    displ.segment(3, 3) = (A.transpose() * nodes[1]->pos_dt).eigen();
    displ.segment(6, 3) = (A.transpose() * nodes[2]->pos_dt).eigen();
    displ.segment(9, 3) = (A.transpose() * nodes[3]->pos_dt).eigen();
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / 4.0;
    displ *= lumped_node_mass * this->Material->Get_RayleighDampingM();
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);
}